

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O3

int ddWindowConv2(DdManager *table,int low,int high)

{
  bool bVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  void *__ptr;
  ulong uVar5;
  uint uVar6;
  int y;
  int x;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar11;
  
  uVar6 = high - low;
  if (uVar6 == 0 || high < low) {
    do {
    } while( true );
  }
  uVar7 = (ulong)uVar6;
  __ptr = malloc(uVar7 * 4);
  auVar2 = _DAT_0094e250;
  if (__ptr == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_00936ec9:
    iVar8 = 0;
  }
  else {
    lVar11 = uVar7 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_0094e250;
    auVar10 = _DAT_0094f530;
    auVar12 = _DAT_0094e240;
    do {
      auVar13 = auVar12 ^ auVar2;
      iVar8 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar8 && auVar9._0_4_ < auVar13._0_4_ || iVar8 < auVar13._4_4_)
                & 1)) {
        *(undefined4 *)((long)__ptr + uVar5 * 4) = 1;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        *(undefined4 *)((long)__ptr + uVar5 * 4 + 4) = 1;
      }
      auVar13 = auVar10 ^ auVar2;
      iVar4 = auVar13._4_4_;
      if (iVar4 <= iVar8 && (iVar4 != iVar8 || auVar13._0_4_ <= auVar9._0_4_)) {
        *(undefined4 *)((long)__ptr + uVar5 * 4 + 8) = 1;
        *(undefined4 *)((long)__ptr + uVar5 * 4 + 0xc) = 1;
      }
      uVar5 = uVar5 + 4;
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar11 + 4;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar11 + 4;
    } while ((uVar6 + 3 & 0xfffffffc) != uVar5);
    iVar8 = table->keys - table->isolated;
    uVar5 = 0;
    bVar3 = false;
    do {
      do {
        bVar1 = bVar3;
        if (*(int *)((long)__ptr + uVar5 * 4) != 0) {
          x = (int)uVar5 + low;
          y = (int)uVar5 + low + 1;
          iVar4 = cuddSwapInPlace(table,x,y);
          if ((iVar4 == 0) || ((iVar8 <= iVar4 && (iVar4 = cuddSwapInPlace(table,x,y), iVar4 == 0)))
             ) {
            free(__ptr);
            goto LAB_00936ec9;
          }
          if (iVar4 < iVar8) {
            if ((long)uVar5 < (long)(int)(uVar6 - 1)) {
              *(undefined4 *)((long)__ptr + uVar5 * 4 + 4) = 1;
            }
            bVar1 = true;
            if (uVar5 != 0) {
              *(undefined4 *)((long)__ptr + uVar5 * 4 + -4) = 1;
            }
          }
          *(undefined4 *)((long)__ptr + uVar5 * 4) = 0;
          iVar8 = iVar4;
        }
        uVar5 = uVar5 + 1;
        bVar3 = bVar1;
      } while (uVar5 != uVar7);
      uVar5 = 0;
      bVar3 = false;
    } while (bVar1);
    free(__ptr);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int
ddWindowConv2(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;
    int size;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 1) return(ddWindowConv2(table,low,high));

    nwin = high-low;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    res = table->keys - table->isolated;
    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                size = res;
                res = cuddSwapInPlace(table,x+low,x+low+1);
                if (res == 0) {
                    ABC_FREE(events);
                    return(0);
                }
                if (res >= size) { /* no improvement: undo permutation */
                    res = cuddSwapInPlace(table,x+low,x+low+1);
                    if (res == 0) {
                        ABC_FREE(events);
                        return(0);
                    }
                }
                if (res < size) {
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res < size) {
                    (void) fprintf(table->out,"-");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}